

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

int Gia_Sim2CompareEqual(uint *p0,uint *p1,int nWords,int fCompl)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  if (0 < nWords) {
    uVar4 = (ulong)(uint)nWords;
  }
  if (fCompl == 0) {
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        return 1;
      }
      puVar1 = p0 + uVar3;
      puVar2 = p1 + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == *puVar2);
  }
  else {
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        return 1;
      }
      puVar1 = p1 + uVar3;
      puVar2 = p0 + uVar3;
      uVar3 = uVar3 + 1;
    } while ((*puVar1 ^ *puVar2) == 0xffffffff);
  }
  return 0;
}

Assistant:

int Gia_Sim2CompareEqual( unsigned * p0, unsigned * p1, int nWords, int fCompl )
{
    int w;
    if ( !fCompl )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 0;
        return 1;
    }
}